

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::AddBlockToLoop(FlowGraph *this,BasicBlock *block,Loop *loop)

{
  RealCount *pRVar1;
  ushort uVar2;
  Type pSVar3;
  
  pSVar3 = (Type)new<Memory::ArenaAllocator>(0x10,(loop->blockList).allocator,0x364470);
  pSVar3[1].next = (Type)block;
  pSVar3->next = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar3;
  pRVar1 = &(loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  uVar2 = *(ushort *)&block->field_0x18;
  if ((uVar2 & 8) != 0) {
    Loop::SetHasCall(loop);
    uVar2 = *(ushort *)&block->field_0x18;
  }
  if ((uVar2 & 0x10) == 0) {
    return;
  }
  Loop::SetHasYield(loop);
  return;
}

Assistant:

void
FlowGraph::AddBlockToLoop(BasicBlock *block, Loop *loop)
{
    loop->blockList.Prepend(block);
    if (block->hasCall)
    {
        loop->SetHasCall();
    }
    if (block->hasYield)
    {
        loop->SetHasYield();
    }
}